

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.cpp
# Opt level: O1

void PrintUsage(void)

{
  fwrite("Usage: sq <scriptpath [args]> [options]\nAvailable options are:\n  -c                        compiles the file to bytecode (default output \'out.cnut\')\n  -o <out-file>             specifies output file for the -c option\n  -ast-dump [out-file]      dump AST into console or file if specified\n  -absolute-path            use absolute path when print diangostics\n  -bytecode-dump [out-file] dump SQ bytecode into console or file if specified\n  -diag-file file           write diagnostics into specified file\n  -sa                       enable static analyzer\n  --inverse-warnings        flip diagnostic state\n  --warnings-list           print all warnings and exit\n  -W<num>                   disable diagnostic by numeric id\n  -<diagnostic-name>        disable diagnostic by text id\n  -optCH                    enable Closure Hoisting Optimization\n  -d                        generates debug infos\n  -v                        displays version\n  -h                        prints help\n"
         ,0x3d2,1,_stderr);
  return;
}

Assistant:

void PrintUsage()
{
    fprintf(stderr,_SC("Usage: sq <scriptpath [args]> [options]\n")
        _SC("Available options are:\n")
        _SC("  -c                        compiles the file to bytecode (default output 'out.cnut')\n")
        _SC("  -o <out-file>             specifies output file for the -c option\n")
        _SC("  -ast-dump [out-file]      dump AST into console or file if specified\n")
        _SC("  -absolute-path            use absolute path when print diangostics\n")
        _SC("  -bytecode-dump [out-file] dump SQ bytecode into console or file if specified\n")
        _SC("  -diag-file file           write diagnostics into specified file\n")
        _SC("  -sa                       enable static analyzer\n")
        _SC("  --inverse-warnings        flip diagnostic state\n")
        _SC("  --warnings-list           print all warnings and exit\n")
        _SC("  -W<num>                   disable diagnostic by numeric id\n")
        _SC("  -<diagnostic-name>        disable diagnostic by text id\n")
        _SC("  -optCH                    enable Closure Hoisting Optimization\n")
        _SC("  -d                        generates debug infos\n")
        _SC("  -v                        displays version\n")
        _SC("  -h                        prints help\n"));
}